

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectorOutput.cpp
# Opt level: O2

void __thiscall
Test::CollectorOutput::finishTestMethod
          (CollectorOutput *this,string *suiteName,string *methodName,string *argString,
          bool withSuccess)

{
  runtime_error *this_00;
  
  if (this->currentMethod != (TestMethodInfo *)0x0) {
    this->currentMethod->withSuccess = withSuccess;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid Test-Method!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CollectorOutput::finishTestMethod(
    const std::string &suiteName, const std::string &methodName, const std::string &argString, const bool withSuccess) {
  if (currentMethod == nullptr)
    throw std::runtime_error("Invalid Test-Method!");
  currentMethod->withSuccess = withSuccess;
}